

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.cpp
# Opt level: O3

RPCHelpMan * wallet::encryptwallet(void)

{
  ulong *puVar1;
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  Fallback fallback;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_00;
  RPCArgOptions opts;
  undefined1 auVar2 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff950;
  pointer in_stack_fffffffffffff958;
  pointer pRVar8;
  pointer in_stack_fffffffffffff960;
  pointer pRVar9;
  pointer in_stack_fffffffffffff968;
  pointer pRVar10;
  undefined1 in_stack_fffffffffffff970 [16];
  _Vector_impl_data in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff998 [16];
  pointer in_stack_fffffffffffff9a8;
  _Alloc_hider in_stack_fffffffffffff9b0;
  _Alloc_hider _Var11;
  size_type in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  _Alloc_hider in_stack_fffffffffffff9d0;
  _Alloc_hider _Var12;
  size_type in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  _Alloc_hider in_stack_fffffffffffff9f0;
  size_type in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  ulong *local_370;
  undefined8 local_368;
  ulong local_360;
  undefined8 uStack_358;
  ulong *local_350;
  size_type local_348;
  ulong local_340;
  undefined8 uStack_338;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"encryptwallet","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nEncrypts the wallet with \'passphrase\'. This is for first time encryption.\nAfter this, any calls that interact with private keys such as sending or signing \nwill require the passphrase to be set prior the making these calls.\nUse the walletpassphrase call for this, and then walletlock call.\nIf the wallet is already encrypted, use the walletpassphrasechange call.\n** IMPORTANT **\nFor security reasons, the encryption process will generate a new HD seed, resulting\nin the creation of a fresh set of active descriptors. Therefore, it is crucial to\nsecurely back up the newly generated wallet file using the backupwallet RPC.\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"passphrase","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,
             "The pass phrase to encrypt the wallet with. It must be at least 1 character, but should be long."
             ,"");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff928;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff938;
  name.field_2._8_8_ = in_stack_fffffffffffff940;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff950;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff948;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffff958;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffff960;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff968;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_16_ = in_stack_fffffffffffff970;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff980._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff980._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff980._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff998;
  description_00._M_string_length = (size_type)in_stack_fffffffffffff9b0._M_p;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9a8;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff9b8;
  description_00.field_2._8_8_ = in_stack_fffffffffffff9c0;
  opts.oneline_description._M_dataplus._M_p = in_stack_fffffffffffff9d0._M_p;
  opts._0_8_ = in_stack_fffffffffffff9c8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff9d8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff9e0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff9e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9f0._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa00;
  opts.hidden = (bool)(char)in_stack_fffffffffffffa08;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffffa08 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffffa08 >> 0x10);
  ::RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_00,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff998,__l,
             (allocator_type *)&stack0xfffffffffffff997);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,"A string with further instructions","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff928;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff938;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff940;
  auVar2._16_8_ = 0;
  auVar2._0_16_ = in_stack_fffffffffffff970;
  ::RPCResult::RPCResult
            (&local_2f0,STR,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffff950,in_stack_fffffffffffff948)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar2 << 0x40),SUB81(local_310,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff928;
  result.m_key_name._M_string_length = in_stack_fffffffffffff938;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff940;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff948;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff950;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  result._64_8_ = pRVar10;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff970._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffff970._8_8_;
  result._88_24_ = in_stack_fffffffffffff980;
  result.m_cond._8_16_ = in_stack_fffffffffffff998;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff9a8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff978,result);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"encryptwallet","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"\"my pass phrase\"","");
  HelpExampleCli(&local_490,&local_4b0,&local_4d0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_490,0,0,"\nEncrypt your wallet\n",0x15);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if (paVar5 == paVar4) {
    local_470.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_470.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_470.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_470._M_dataplus._M_p = (pointer)paVar5;
  }
  local_470._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_470,
                      "\nNow set the passphrase to use the wallet, such as for signing or sending bitcoin\n"
                     );
  local_450._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p == paVar5) {
    local_450.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_450.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_450.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  }
  else {
    local_450.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_450._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"walletpassphrase","");
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"\"my pass phrase\"","");
  HelpExampleCli(&local_4f0,&local_510,&local_530);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    uVar6 = local_450.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_4f0._M_string_length + local_450._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      uVar6 = local_4f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_4f0._M_string_length + local_450._M_string_length) goto LAB_005ca040;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_4f0,0,0,local_450._M_dataplus._M_p,local_450._M_string_length);
  }
  else {
LAB_005ca040:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_450,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_430.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_430.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_430.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_430._M_dataplus._M_p = (pointer)paVar4;
  }
  local_430._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_430,"\nNow we can do something like sign\n");
  local_410._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p == paVar5) {
    local_410.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_410.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_410.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  }
  else {
    local_410.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_410._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"signmessage","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_590,"\"address\" \"test message\"","");
  HelpExampleCli(&local_550,&local_570,&local_590);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    uVar6 = local_410.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_550._M_string_length + local_410._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      uVar6 = local_550.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_550._M_string_length + local_410._M_string_length) goto LAB_005ca1dd;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_550,0,0,local_410._M_dataplus._M_p,local_410._M_string_length);
  }
  else {
LAB_005ca1dd:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_410,local_550._M_dataplus._M_p,local_550._M_string_length);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_3f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_3f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_3f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_3f0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_3f0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3f0,"\nNow lock the wallet again by removing the passphrase\n");
  local_3d0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p == paVar5) {
    local_3d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_3d0.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_3d0.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  }
  else {
    local_3d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_3d0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"walletlock","");
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"");
  HelpExampleCli(&local_5b0,&local_5d0,&local_5f0);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    uVar6 = local_3d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_5b0._M_string_length + local_3d0._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      uVar6 = local_5b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_5b0._M_string_length + local_3d0._M_string_length) goto LAB_005ca376;
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_5b0,0,0,local_3d0._M_dataplus._M_p,local_3d0._M_string_length);
  }
  else {
LAB_005ca376:
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_3d0,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar4 == paVar5) {
    local_3b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_3b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_3b0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_3b0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_3b0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3b0,"\nAs a JSON-RPC call\n");
  paVar5 = &local_390.field_2;
  local_390._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p == paVar4) {
    local_390.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_390.field_2._8_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 8);
    local_390.field_2._12_4_ = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
    local_390._M_dataplus._M_p = (pointer)paVar5;
  }
  else {
    local_390.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_390._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  _Var12._M_p = &stack0xfffffffffffff9e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9d0,"encryptwallet","");
  _Var11._M_p = &stack0xfffffffffffff9c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9b0,"\"my pass phrase\"","");
  HelpExampleRpc((string *)&stack0xfffffffffffff9f0,(string *)&stack0xfffffffffffff9d0,
                 (string *)&stack0xfffffffffffff9b0);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar5) {
    uVar6 = local_390.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < in_stack_fffffffffffff9f8 + local_390._M_string_length) {
    uVar6 = 0xf;
    if (in_stack_fffffffffffff9f0._M_p != &stack0xfffffffffffffa00) {
      uVar6 = in_stack_fffffffffffffa00;
    }
    if (in_stack_fffffffffffff9f8 + local_390._M_string_length <= (ulong)uVar6) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffff9f0,0,0,local_390._M_dataplus._M_p,
                       local_390._M_string_length);
      goto LAB_005ca535;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_390,in_stack_fffffffffffff9f0._M_p,in_stack_fffffffffffff9f8);
LAB_005ca535:
  local_370 = &local_360;
  puVar1 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar4) {
    local_360 = paVar4->_M_allocated_capacity;
    uStack_358 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_360 = paVar4->_M_allocated_capacity;
    local_370 = puVar1;
  }
  local_348 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if (local_370 == &local_360) {
    uStack_338 = uStack_358;
    local_350 = &local_340;
  }
  else {
    local_350 = local_370;
  }
  local_340 = local_360;
  local_368 = 0;
  local_360 = local_360 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/encrypt.cpp:244:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/encrypt.cpp:244:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/encrypt.cpp:244:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar8;
  description.field_2._8_8_ = pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff970._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff970._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff9a8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff998._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff998._8_8_;
  examples.m_examples.field_2._8_8_ = _Var11._M_p;
  local_370 = &local_360;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff938)),description,args,
             (RPCResults)in_stack_fffffffffffff980,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff938,&stack0xfffffffffffff938,3);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (in_stack_fffffffffffff9f0._M_p != &stack0xfffffffffffffa00) {
    operator_delete(in_stack_fffffffffffff9f0._M_p,in_stack_fffffffffffffa00 + 1);
  }
  if (_Var11._M_p != &stack0xfffffffffffff9c0) {
    operator_delete(_Var11._M_p,in_stack_fffffffffffff9c0 + 1);
  }
  if (_Var12._M_p != &stack0xfffffffffffff9e0) {
    operator_delete(_Var12._M_p,in_stack_fffffffffffff9e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar5) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff978);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff958);
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff998);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan encryptwallet()
{
    return RPCHelpMan{"encryptwallet",
                "\nEncrypts the wallet with 'passphrase'. This is for first time encryption.\n"
                "After this, any calls that interact with private keys such as sending or signing \n"
                "will require the passphrase to be set prior the making these calls.\n"
                "Use the walletpassphrase call for this, and then walletlock call.\n"
                "If the wallet is already encrypted, use the walletpassphrasechange call.\n"
                "** IMPORTANT **\n"
                "For security reasons, the encryption process will generate a new HD seed, resulting\n"
                "in the creation of a fresh set of active descriptors. Therefore, it is crucial to\n"
                "securely back up the newly generated wallet file using the backupwallet RPC.\n",
                {
                    {"passphrase", RPCArg::Type::STR, RPCArg::Optional::NO, "The pass phrase to encrypt the wallet with. It must be at least 1 character, but should be long."},
                },
                RPCResult{RPCResult::Type::STR, "", "A string with further instructions"},
                RPCExamples{
            "\nEncrypt your wallet\n"
            + HelpExampleCli("encryptwallet", "\"my pass phrase\"") +
            "\nNow set the passphrase to use the wallet, such as for signing or sending bitcoin\n"
            + HelpExampleCli("walletpassphrase", "\"my pass phrase\"") +
            "\nNow we can do something like sign\n"
            + HelpExampleCli("signmessage", "\"address\" \"test message\"") +
            "\nNow lock the wallet again by removing the passphrase\n"
            + HelpExampleCli("walletlock", "") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("encryptwallet", "\"my pass phrase\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ENCRYPTION_FAILED, "Error: wallet does not contain private keys, nothing to encrypt.");
    }

    if (pwallet->IsCrypted()) {
        throw JSONRPCError(RPC_WALLET_WRONG_ENC_STATE, "Error: running with an encrypted wallet, but encryptwallet was called.");
    }

    if (pwallet->IsScanningWithPassphrase()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: the wallet is currently being used to rescan the blockchain for related transactions. Please call `abortrescan` before encrypting the wallet.");
    }

    LOCK2(pwallet->m_relock_mutex, pwallet->cs_wallet);

    SecureString strWalletPass;
    strWalletPass.reserve(100);
    strWalletPass = std::string_view{request.params[0].get_str()};

    if (strWalletPass.empty()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "passphrase cannot be empty");
    }

    if (!pwallet->EncryptWallet(strWalletPass)) {
        throw JSONRPCError(RPC_WALLET_ENCRYPTION_FAILED, "Error: Failed to encrypt the wallet.");
    }

    return "wallet encrypted; The keypool has been flushed and a new HD seed was generated. You need to make a new backup with the backupwallet RPC.";
},
    };
}